

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

int __thiscall QGuiApplicationPrivate::init(QGuiApplicationPrivate *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  QGuiApplication *app;
  int *piVar2;
  char16_t *pcVar3;
  QChar *pQVar4;
  qsizetype qVar5;
  Data *pDVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  storage_type *psVar11;
  ulong uVar12;
  QOpenGLContext *pQVar13;
  void *pvVar14;
  QObject *pQVar15;
  QSessionManager *this_00;
  code *pcVar16;
  undefined4 *puVar17;
  ImplFn p_Var18;
  int iVar19;
  storage_type *psVar20;
  longlong lVar21;
  QArrayData *pQVar22;
  QArrayDataPointer<QByteArray> *ctx_00;
  long lVar23;
  char *__s1;
  long lVar24;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  uint local_1a4;
  QObject local_190 [8];
  QArrayData *local_188;
  undefined1 *puStack_180;
  undefined1 *local_178;
  QString local_168;
  QString local_148;
  QString local_128;
  QArrayDataPointer<QByteArray> local_108;
  QArrayDataPointer<QByteArray> local_e8;
  char *local_d0;
  QArrayData *local_c0;
  storage_type *local_b8;
  storage_type *local_b0;
  QString local_a8;
  QArrayData *local_90;
  storage_type *local_88;
  storage_type *local_80;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplicationPrivate::init();
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  local_108.d = (Data *)0x0;
  local_108.ptr = (QByteArray *)0x0;
  local_108.size = 0;
  local_128.d.d = (Data *)0x0;
  local_128.d.ptr = (char16_t *)0x0;
  local_128.d.size = 0;
  local_148.d.d = (Data *)0x0;
  local_148.d.ptr = (char16_t *)0x0;
  local_148.d.size = 0;
  local_168.d.d = (Data *)0x0;
  local_168.d.ptr = (char16_t *)0x0;
  bVar7 = false;
  local_168.d.size = 0;
  iVar10 = **(int **)&this->field_0x80;
  local_1a4 = (uint)(iVar10 != 0);
  if (1 < iVar10) {
    iVar19 = 1;
    bVar7 = false;
    do {
      lVar23 = *(long *)&this->field_0x88;
      lVar24 = (long)iVar19;
      pcVar1 = *(char **)(lVar23 + lVar24 * 8);
      if (pcVar1 != (char *)0x0) {
        if (*pcVar1 == '-') {
          __s1 = pcVar1 + 1;
          if (pcVar1[1] != '-') {
            __s1 = pcVar1;
          }
          iVar9 = strcmp(__s1,"-plugin");
          if (iVar9 == 0) {
            iVar19 = iVar19 + 1;
            pQVar22 = &(local_168.d.d)->super_QArrayData;
            if (iVar19 < iVar10) {
              QByteArray::QByteArray
                        ((QByteArray *)&local_e8,*(char **)(lVar23 + (long)iVar19 * 8),-1);
              QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                        ((QMovableArrayOps<QByteArray> *)&local_108,local_108.size,
                         (QByteArray *)&local_e8);
              QList<QByteArray>::end((QList<QByteArray> *)&local_108);
              piVar2 = (int *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
              pQVar22 = &(local_168.d.d)->super_QArrayData;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_),1,0x10);
                  pQVar22 = &(local_168.d.d)->super_QArrayData;
                }
              }
            }
          }
          else {
            iVar9 = strcmp(__s1,"-reverse");
            if (iVar9 == 0) {
              force_reverse = 1;
              pQVar22 = &(local_168.d.d)->super_QArrayData;
            }
            else {
              iVar9 = strcmp(__s1,"-session");
              if ((iVar9 == 0) && (iVar19 < iVar10 + -1)) {
                iVar19 = iVar19 + 1;
                pcVar1 = *(char **)(lVar23 + 8 + lVar24 * 8);
                pQVar22 = &(local_168.d.d)->super_QArrayData;
                if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
                  lVar23 = *(long *)(lVar23 + (lVar24 + 1) * 8);
                  if (lVar23 == 0) {
                    psVar20 = (storage_type *)0x0;
                  }
                  else {
                    psVar11 = (storage_type *)0xffffffffffffffff;
                    do {
                      psVar20 = psVar11 + 1;
                      pcVar1 = psVar11 + lVar23 + 1;
                      psVar11 = psVar20;
                    } while (*pcVar1 != '\0');
                  }
                  QVar26.m_data = psVar20;
                  QVar26.m_size = (qsizetype)&local_e8;
                  QString::fromLatin1(QVar26);
                  pDVar6 = local_128.d.d;
                  pQVar22 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                  pQVar4 = (QChar *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                  local_e8.d._0_4_ = SUB84(local_128.d.d,0);
                  local_e8.d._4_4_ = (undefined4)((ulong)local_128.d.d >> 0x20);
                  uVar12 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                  local_e8.ptr._0_4_ = SUB84(local_128.d.ptr,0);
                  local_e8.ptr._4_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
                  local_e8.size._0_4_ = (undefined4)local_128.d.size;
                  local_e8.size._4_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
                  local_128.d.ptr = (char16_t *)pQVar4;
                  local_128.d.size = uVar12;
                  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_128.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      local_128.d.d = (Data *)pQVar22;
                      QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                      pQVar22 = &(local_128.d.d)->super_QArrayData;
                    }
                  }
                  local_128.d.d = (Data *)pQVar22;
                  local_e8.d._0_4_ = (undefined4)local_128.d.size;
                  local_e8.d._4_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
                  local_e8.ptr._0_4_ = SUB84(local_128.d.ptr,0);
                  local_e8.ptr._4_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
                  uVar12 = QStringView::indexOf
                                     ((QStringView *)&local_e8,(QChar)0x5f,0,CaseSensitive);
                  pQVar22 = &(local_128.d.d)->super_QArrayData;
                  if (-1 < (long)uVar12) {
                    QString::mid((longlong)&local_e8,(longlong)&local_128);
                    pDVar6 = local_148.d.d;
                    pQVar22 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                    pcVar3 = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                    local_e8.d._0_4_ = SUB84(local_148.d.d,0);
                    local_e8.d._4_4_ = (undefined4)((ulong)local_148.d.d >> 0x20);
                    qVar5 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                    local_e8.ptr._0_4_ = SUB84(local_148.d.ptr,0);
                    local_e8.ptr._4_4_ = (undefined4)((ulong)local_148.d.ptr >> 0x20);
                    local_e8.size._0_4_ = (undefined4)local_148.d.size;
                    local_e8.size._4_4_ = (undefined4)((ulong)local_148.d.size >> 0x20);
                    local_148.d.ptr = pcVar3;
                    local_148.d.size = qVar5;
                    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_148.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        local_148.d.d = (Data *)pQVar22;
                        QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                        pQVar22 = &(local_148.d.d)->super_QArrayData;
                      }
                    }
                    local_148.d.d = (Data *)pQVar22;
                    if (uVar12 < (ulong)local_128.d.size) {
                      QString::QString((QString *)&local_e8,(QChar *)local_128.d.ptr,uVar12);
                    }
                    else {
                      local_e8.d._0_4_ = SUB84(local_128.d.d,0);
                      local_e8.d._4_4_ = (undefined4)((ulong)local_128.d.d >> 0x20);
                      local_e8.ptr._0_4_ = SUB84(local_128.d.ptr,0);
                      local_e8.ptr._4_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
                      local_e8.size._0_4_ = (undefined4)local_128.d.size;
                      local_e8.size._4_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
                      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_128.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + 1;
                        UNLOCK();
                      }
                    }
                    pDVar6 = local_128.d.d;
                    pQVar22 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                    pQVar4 = (QChar *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                    local_e8.d._0_4_ = SUB84(local_128.d.d,0);
                    local_e8.d._4_4_ = (undefined4)((ulong)local_128.d.d >> 0x20);
                    uVar12 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                    local_e8.ptr._0_4_ = SUB84(local_128.d.ptr,0);
                    local_e8.ptr._4_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
                    local_e8.size._0_4_ = (undefined4)local_128.d.size;
                    local_e8.size._4_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
                    local_128.d.ptr = (char16_t *)pQVar4;
                    local_128.d.size = uVar12;
                    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_128.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        local_128.d.d = (Data *)pQVar22;
                        QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                        pQVar22 = &(local_128.d.d)->super_QArrayData;
                      }
                    }
                  }
                  local_128.d.d = (Data *)pQVar22;
                  this->is_session_restored = true;
                  pQVar22 = &(local_168.d.d)->super_QArrayData;
                }
              }
              else {
                iVar9 = strcmp(__s1,"-testability");
                if (iVar9 == 0) {
                  bVar7 = true;
                  pQVar22 = &(local_168.d.d)->super_QArrayData;
                }
                else {
                  iVar9 = strncmp(__s1,"-style=",7);
                  if (iVar9 == 0) {
                    psVar20 = (storage_type *)0xffffffffffffffff;
                    do {
                      pcVar1 = __s1 + 8 + (long)psVar20;
                      psVar20 = psVar20 + 1;
                    } while (*pcVar1 != '\0');
                    QVar25.m_data = psVar20;
                    QVar25.m_size = (qsizetype)&local_e8;
                    QString::fromLocal8Bit(QVar25);
                    pDVar6 = local_168.d.d;
                    pQVar22 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                    pcVar3 = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                    local_e8.d._0_4_ = SUB84(local_168.d.d,0);
                    local_e8.d._4_4_ = (undefined4)((ulong)local_168.d.d >> 0x20);
                    lVar23 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                    local_e8.ptr._0_4_ = SUB84(local_168.d.ptr,0);
                    local_e8.ptr._4_4_ = (undefined4)((ulong)local_168.d.ptr >> 0x20);
                    local_e8.size._0_4_ = (undefined4)local_168.d.size;
                    local_e8.size._4_4_ = (undefined4)((ulong)local_168.d.size >> 0x20);
                    local_168.d.ptr = pcVar3;
                    local_168.d.size = lVar23;
                    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_168.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        local_168.d.d = (Data *)pQVar22;
                        QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                        pQVar22 = &(local_168.d.d)->super_QArrayData;
                      }
                    }
                  }
                  else {
                    iVar9 = strcmp(__s1,"-style");
                    if ((iVar9 == 0) && (iVar19 < iVar10 + -1)) {
                      lVar23 = *(long *)(lVar23 + 8 + lVar24 * 8);
                      if (lVar23 == 0) {
                        psVar20 = (storage_type *)0x0;
                      }
                      else {
                        psVar11 = (storage_type *)0xffffffffffffffff;
                        do {
                          psVar20 = psVar11 + 1;
                          pcVar1 = psVar11 + lVar23 + 1;
                          psVar11 = psVar20;
                        } while (*pcVar1 != '\0');
                      }
                      QVar27.m_data = psVar20;
                      QVar27.m_size = (qsizetype)&local_e8;
                      QString::fromLocal8Bit(QVar27);
                      pDVar6 = local_168.d.d;
                      pQVar22 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                      pcVar3 = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                      local_e8.d._0_4_ = SUB84(local_168.d.d,0);
                      local_e8.d._4_4_ = (undefined4)((ulong)local_168.d.d >> 0x20);
                      lVar23 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                      local_e8.ptr._0_4_ = SUB84(local_168.d.ptr,0);
                      local_e8.ptr._4_4_ = (undefined4)((ulong)local_168.d.ptr >> 0x20);
                      local_e8.size._0_4_ = (undefined4)local_168.d.size;
                      local_e8.size._4_4_ = (undefined4)((ulong)local_168.d.size >> 0x20);
                      local_168.d.ptr = pcVar3;
                      local_168.d.size = lVar23;
                      if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_168.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_168.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          local_168.d.d = (Data *)pQVar22;
                          QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                          pQVar22 = &(local_168.d.d)->super_QArrayData;
                        }
                      }
                      local_168.d.d = (Data *)pQVar22;
                      iVar19 = iVar19 + 1;
                      pQVar22 = &(local_168.d.d)->super_QArrayData;
                    }
                    else {
                      lVar24 = (long)(int)local_1a4;
                      local_1a4 = local_1a4 + 1;
                      *(char **)(lVar23 + lVar24 * 8) = pcVar1;
                      pQVar22 = &(local_168.d.d)->super_QArrayData;
                    }
                  }
                }
              }
            }
          }
          local_168.d.d = (Data *)pQVar22;
          if (local_168.d.size != 0) {
            QString::operator=(&styleOverride,&local_168);
          }
        }
        else {
          lVar24 = (long)(int)local_1a4;
          local_1a4 = local_1a4 + 1;
          *(char **)(lVar23 + lVar24 * 8) = pcVar1;
        }
      }
      iVar19 = iVar19 + 1;
      iVar10 = **(int **)&this->field_0x80;
    } while (iVar19 < iVar10);
  }
  if ((int)local_1a4 < iVar10) {
    *(undefined8 *)(*(long *)&this->field_0x88 + (long)(int)local_1a4 * 8) = 0;
    **(uint **)&this->field_0x80 = local_1a4;
  }
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  local_188 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_180 = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_188);
  if (local_178 != (undefined1 *)0x0) {
    QByteArray::split((char)&local_e8);
    QList<QByteArray>::operator+=((QList<QByteArray> *)&local_108,(QList<QByteArray> *)&local_e8);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_e8);
  }
  if (platform_integration == (QPlatformIntegration *)0x0) {
    createPlatformIntegration(this);
  }
  updatePalette();
  QFont::initialize();
  initThemeHints();
  QCursorData::initialize();
  qRegisterGuiVariant();
  qRegisterGuiGetInterpolator();
  cVar8 = QCoreApplication::testAttribute(AA_ShareOpenGLContexts);
  if ((cVar8 != '\0') && (pQVar13 = qt_gl_global_share_context(), pQVar13 == (QOpenGLContext *)0x0))
  {
    pQVar13 = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(pQVar13,(QObject *)0x0);
    QSurfaceFormat::defaultFormat();
    QOpenGLContext::setFormat(pQVar13,(QSurfaceFormat *)&local_e8);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_e8);
    QOpenGLContext::create(pQVar13);
    qt_gl_set_global_share_context(pQVar13);
    this->ownGlobalShareContext = true;
  }
  QElapsedTimer::start();
  QCoreApplicationPrivate::is_app_running._0_1_ = 1;
  if (local_108.size != 0) {
    lVar23 = 0x10;
    uVar12 = 0;
    do {
      local_58.d.d = *(Data **)((long)local_108.ptr + lVar23 + -0x10);
      p_Var18 = *(ImplFn *)((long)local_108.ptr + lVar23 + -8);
      psVar20 = *(storage_type **)((long)&((local_108.ptr)->d).d + lVar23);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_58.d.ptr = (char16_t *)p_Var18;
      local_58.d.size = (qsizetype)psVar20;
      if ((psVar20 == (storage_type *)0x0) ||
         (pvVar14 = memchr(p_Var18,0x3a,(size_t)psVar20), pvVar14 == (void *)0x0)) {
        lVar24 = -1;
      }
      else {
        lVar24 = (long)pvVar14 - (long)p_Var18;
      }
      if (lVar24 < 0) {
        if (p_Var18 == (ImplFn)0x0) {
          psVar20 = (storage_type *)0x0;
        }
        QVar30.m_data = psVar20;
        QVar30.m_size = (qsizetype)&local_e8;
        QString::fromLatin1(QVar30);
        local_78.d.d = (Data *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
        local_78.d.ptr = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
        local_78.d.size = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
        local_e8.d._0_4_ = 0;
        local_e8.d._4_4_ = 0;
        local_e8.ptr._0_4_ = 0;
        local_e8.ptr._4_4_ = 0;
        local_e8.size._0_4_ = 0;
        local_e8.size._4_4_ = 0;
        pQVar15 = QGenericPluginFactory::create(&local_78,(QString *)&local_e8);
        piVar2 = (int *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_),2,0x10)
            ;
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            lVar21 = 2;
            pQVar22 = &(local_78.d.d)->super_QArrayData;
            goto LAB_002ce3f4;
          }
        }
      }
      else {
        QByteArray::mid((longlong)&local_90,(longlong)&local_58);
        psVar20 = local_88;
        if (local_88 != (storage_type *)0x0) {
          psVar20 = local_80;
        }
        QVar28.m_data = psVar20;
        QVar28.m_size = (qsizetype)&local_e8;
        QString::fromLatin1(QVar28);
        local_78.d.d = (Data *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
        local_78.d.ptr = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
        local_78.d.size = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
        QByteArray::mid((longlong)&local_c0,(longlong)&local_58);
        psVar20 = local_b8;
        if (local_b8 != (storage_type *)0x0) {
          psVar20 = local_b0;
        }
        QVar29.m_data = psVar20;
        QVar29.m_size = (qsizetype)&local_e8;
        QString::fromLatin1(QVar29);
        local_a8.d.d = (Data *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
        local_a8.d.ptr = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
        local_a8.d.size = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
        pQVar15 = QGenericPluginFactory::create(&local_78,&local_a8);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_c0 != (QArrayData *)0x0) {
          LOCK();
          (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_c0,1,0x10);
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_90 != (QArrayData *)0x0) {
          LOCK();
          (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            lVar21 = 1;
            pQVar22 = local_90;
LAB_002ce3f4:
            QArrayData::deallocate(pQVar22,lVar21,0x10);
          }
        }
      }
      if (pQVar15 == (QObject *)0x0) {
        local_e8.d._0_4_ = 2;
        local_e8.d._4_4_ = 0;
        local_e8.ptr._0_4_ = 0;
        local_e8.ptr._4_4_ = 0;
        local_e8.size._0_4_ = 0;
        local_e8.size._4_4_ = 0;
        local_d0 = "default";
        p_Var18 = (ImplFn)local_58.d.ptr;
        if ((ImplFn)local_58.d.ptr == (ImplFn)0x0) {
          p_Var18 = (ImplFn)&QByteArray::_empty;
        }
        QMessageLogger::warning((char *)&local_e8,"No such plugin for spec \"%s\"",p_Var18);
      }
      else {
        local_e8.d._0_4_ = SUB84(pQVar15,0);
        local_e8.d._4_4_ = (undefined4)((ulong)pQVar15 >> 0x20);
        QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
                  ((QPodArrayOps<QObject*> *)&generic_plugin_list,generic_plugin_list.d.size,
                   (QObject **)&local_e8);
        QList<QObject_*>::end(&generic_plugin_list);
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar12 = uVar12 + 1;
      lVar23 = lVar23 + 0x18;
    } while (uVar12 < (ulong)local_108.size);
  }
  QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
  app = *(QGuiApplication **)&this->field_0x8;
  this_00 = (QSessionManager *)operator_new(0x10);
  QSessionManager::QSessionManager(this_00,app,&local_128,&local_148);
  this->session_manager = this_00;
  iVar10 = qEnvironmentVariableIntValue("QT_LOAD_TESTABILITY",(bool *)0x0);
  if (0 < iVar10 || bVar7) {
    local_e8.size._0_4_ = 0xaaaaaaaa;
    local_e8.size._4_4_ = 0xaaaaaaaa;
    local_e8.d._0_4_ = 0xaaaaaaaa;
    local_e8.d._4_4_ = 0xaaaaaaaa;
    local_e8.ptr._0_4_ = 0xaaaaaaaa;
    local_e8.ptr._4_4_ = 0xaaaaaaaa;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = L"qttestability";
    local_58.d.size = 0xd;
    QLibrary::QLibrary((QLibrary *)&local_e8,&local_58,(QObject *)0x0);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    cVar8 = QLibrary::load();
    if (cVar8 == '\0') {
      init((EVP_PKEY_CTX *)&local_e8);
    }
    else {
      ctx_00 = &local_e8;
      pcVar16 = (code *)QLibrary::resolve((char *)ctx_00);
      if (pcVar16 == (code *)0x0) {
        init((EVP_PKEY_CTX *)ctx_00);
      }
      else {
        (*pcVar16)();
      }
    }
    QLibrary::~QLibrary((QLibrary *)&local_e8);
  }
  QGuiApplication::setLayoutDirection(layout_direction);
  if (displayName == (QString *)0x0) {
    local_58.d.d = (Data *)QGuiApplication::applicationDisplayNameChanged;
    local_58.d.ptr = (char16_t *)0x0;
    local_e8.d._0_4_ = 0x8208c0;
    local_e8.d._4_4_ = 0;
    local_e8.ptr._0_4_ = 0;
    local_e8.ptr._4_4_ = 0;
    puVar17 = (undefined4 *)operator_new(0x20);
    *puVar17 = 1;
    *(code **)(puVar17 + 2) =
         QtPrivate::QCallableObject<void_(QGuiApplication::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar17 + 4) = QGuiApplication::applicationDisplayNameChanged;
    *(undefined8 *)(puVar17 + 6) = 0;
    QObject::connectImpl
              (local_190,(void **)app,(QObject *)&local_e8,(void **)app,(QSlotObjectBase *)&local_58
               ,(ConnectionType)puVar17,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_190);
  }
  if (local_188 != (QArrayData *)0x0) {
    LOCK();
    (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_188->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_188->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_188,1,0x10);
    }
  }
  if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

QGuiApplicationPrivate::init()
{
    Q_TRACE_SCOPE(QGuiApplicationPrivate_init);

#if defined(Q_OS_MACOS)
    QMacAutoReleasePool pool;
#endif

    QCoreApplicationPrivate::init();

    QCoreApplicationPrivate::is_app_running = false; // Starting up.

    bool loadTestability = false;
    QList<QByteArray> pluginList;
    // Get command line params
#ifndef QT_NO_SESSIONMANAGER
    QString session_id;
    QString session_key;
# if defined(Q_OS_WIN)
    wchar_t guidstr[40];
    GUID guid;
    CoCreateGuid(&guid);
    StringFromGUID2(guid, guidstr, 40);
    session_id = QString::fromWCharArray(guidstr);
    CoCreateGuid(&guid);
    StringFromGUID2(guid, guidstr, 40);
    session_key = QString::fromWCharArray(guidstr);
# endif
#endif
    QString s;
    int j = argc ? 1 : 0;
    for (int i=1; i<argc; i++) {
        if (!argv[i])
            continue;
        if (*argv[i] != '-') {
            argv[j++] = argv[i];
            continue;
        }
        const char *arg = argv[i];
        if (arg[1] == '-') // startsWith("--")
            ++arg;
        if (strcmp(arg, "-plugin") == 0) {
            if (++i < argc)
                pluginList << argv[i];
        } else if (strcmp(arg, "-reverse") == 0) {
            force_reverse = true;
#ifdef Q_OS_MAC
        } else if (strncmp(arg, "-psn_", 5) == 0) {
            // eat "-psn_xxxx" on Mac, which is passed when starting an app from Finder.
            // special hack to change working directory (for an app bundle) when running from finder
            if (QDir::currentPath() == "/"_L1) {
                QCFType<CFURLRef> bundleURL(CFBundleCopyBundleURL(CFBundleGetMainBundle()));
                QString qbundlePath = QCFString(CFURLCopyFileSystemPath(bundleURL,
                                                                        kCFURLPOSIXPathStyle));
                if (qbundlePath.endsWith(".app"_L1))
                    QDir::setCurrent(qbundlePath.section(u'/', 0, -2));
            }
#endif
#ifndef QT_NO_SESSIONMANAGER
        } else if (strcmp(arg, "-session") == 0 && i < argc - 1) {
            ++i;
            if (argv[i] && *argv[i]) {
                session_id = QString::fromLatin1(argv[i]);
                qsizetype p = session_id.indexOf(u'_');
                if (p >= 0) {
                    session_key = session_id.mid(p +1);
                    session_id = session_id.left(p);
                }
                is_session_restored = true;
            }
#endif
        } else if (strcmp(arg, "-testability") == 0) {
            loadTestability = true;
        } else if (strncmp(arg, "-style=", 7) == 0) {
            s = QString::fromLocal8Bit(arg + 7);
        } else if (strcmp(arg, "-style") == 0 && i < argc - 1) {
            s = QString::fromLocal8Bit(argv[++i]);
        } else {
            argv[j++] = argv[i];
        }

        if (!s.isEmpty())
            styleOverride = s;
    }

    if (j < argc) {
        argv[j] = nullptr;
        argc = j;
    }

    // Load environment exported generic plugins
    QByteArray envPlugins = qgetenv("QT_QPA_GENERIC_PLUGINS");
    if (!envPlugins.isEmpty())
        pluginList += envPlugins.split(',');

    if (platform_integration == nullptr)
        createPlatformIntegration();

    updatePalette();
    QFont::initialize();
    initThemeHints();

#ifndef QT_NO_CURSOR
    QCursorData::initialize();
#endif

    // trigger registering of QVariant's GUI types
    qRegisterGuiVariant();

#if QT_CONFIG(animation)
    // trigger registering of animation interpolators
    qRegisterGuiGetInterpolator();
#endif

    // set a global share context when enabled unless there is already one
#ifndef QT_NO_OPENGL
    if (qApp->testAttribute(Qt::AA_ShareOpenGLContexts) && !qt_gl_global_share_context()) {
        QOpenGLContext *ctx = new QOpenGLContext;
        ctx->setFormat(QSurfaceFormat::defaultFormat());
        ctx->create();
        qt_gl_set_global_share_context(ctx);
        ownGlobalShareContext = true;
    }
#endif

    QWindowSystemInterfacePrivate::eventTime.start();

    is_app_running = true;
    init_plugins(pluginList);
    QWindowSystemInterface::flushWindowSystemEvents();

    Q_Q(QGuiApplication);
#ifndef QT_NO_SESSIONMANAGER
    // connect to the session manager
    session_manager = new QSessionManager(q, session_id, session_key);
#endif

#if QT_CONFIG(library)
    if (qEnvironmentVariableIntValue("QT_LOAD_TESTABILITY") > 0)
        loadTestability = true;

    if (loadTestability) {
        QLibrary testLib(QStringLiteral("qttestability"));
        if (Q_UNLIKELY(!testLib.load())) {
            qCritical() << "Library qttestability load failed:" << testLib.errorString();
        } else {
            typedef void (*TasInitialize)(void);
            TasInitialize initFunction = (TasInitialize)testLib.resolve("qt_testability_init");
            if (Q_UNLIKELY(!initFunction)) {
                qCritical("Library qttestability resolve failed!");
            } else {
                initFunction();
            }
        }
    }
#else
    Q_UNUSED(loadTestability);
#endif // QT_CONFIG(library)

    // trigger changed signal and event delivery
    QGuiApplication::setLayoutDirection(layout_direction);

    if (!QGuiApplicationPrivate::displayName)
        QObject::connect(q, &QGuiApplication::applicationNameChanged,
                         q, &QGuiApplication::applicationDisplayNameChanged);
}